

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuDefs.cpp
# Opt level: O2

void __thiscall
tcu::TestException::TestException
          (TestException *this,char *message,char *expr,char *file,int line,qpTestResult result)

{
  undefined4 in_register_00000084;
  string sStack_38;
  
  formatError_abi_cxx11_
            (&sStack_38,(tcu *)message,expr,file,(char *)CONCAT44(in_register_00000084,line),result)
  ;
  Exception::Exception(&this->super_Exception,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  *(undefined ***)&this->super_Exception = &PTR__Exception_00192ba8;
  this->m_result = result;
  return;
}

Assistant:

TestException::TestException (const char* message, const char* expr, const char* file, int line, qpTestResult result)
	: Exception	(formatError(message, expr, file, line))
	, m_result	(result)
{
}